

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Del
          (PersistentStorageJson *this,RegistrarId *aId)

{
  Status SVar1;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,JSON_DOM_abi_cxx11_,DAT_003adb48 + JSON_DOM_abi_cxx11_);
  SVar1 = DelId<ot::commissioner::persistent_storage::Domain,ot::commissioner::persistent_storage::DomainId>
                    (this,aId,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Del(DomainId const &aId)
{
    return DelId<Domain, DomainId>(aId, JSON_DOM);
}